

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-posix.cpp
# Opt level: O1

void __thiscall Dashel::Stream::fail(Stream *this,Source s,int se,char *reason)

{
  string *psVar1;
  char *pcVar2;
  int *piVar3;
  char *__s;
  DashelException *this_00;
  string sysMessage;
  undefined1 *local_50;
  char *local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  local_48 = (char *)0x0;
  local_40[0] = 0;
  this->failedFlag = true;
  if (se != 0) {
    piVar3 = __errno_location();
    __s = strerror(*piVar3);
    pcVar2 = local_48;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)&local_50,0,pcVar2,(ulong)__s);
  }
  psVar1 = &this->failReason;
  pcVar2 = (char *)(this->failReason)._M_string_length;
  strlen(reason);
  std::__cxx11::string::_M_replace((ulong)psVar1,0,pcVar2,(ulong)reason);
  std::__cxx11::string::append((char *)psVar1);
  std::__cxx11::string::_M_append((char *)psVar1,(ulong)local_50);
  this_00 = (DashelException *)__cxa_allocate_exception(0x20);
  DashelException::DashelException(this_00,s,se,(this->failReason)._M_dataplus._M_p,this);
  __cxa_throw(this_00,&DashelException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Stream::fail(DashelException::Source s, int se, const char* reason)
	{
		string sysMessage;
		failedFlag = true;

		if (se)
			sysMessage = strerror(errno);

		failReason = reason;
		failReason += " ";
		failReason += sysMessage;

		throw DashelException(s, se, failReason.c_str(), this);
	}